

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcSymObjBase::inherit_vocab(CTcSymObjBase *this)

{
  CTcSymObj *in_RDI;
  CTcObjScEntry *sc;
  CTcSymObjBase *this_00;
  
  if ((*(ushort *)&(in_RDI->super_CTcSymObjBase).field_0xb8 >> 8 & 1) == 0) {
    *(ushort *)&(in_RDI->super_CTcSymObjBase).field_0xb8 =
         *(ushort *)&(in_RDI->super_CTcSymObjBase).field_0xb8 & 0xfeff | 0x100;
    for (this_00 = (CTcSymObjBase *)(in_RDI->super_CTcSymObjBase).sc_;
        this_00 != (CTcSymObjBase *)0x0;
        this_00 = (CTcSymObjBase *)
                  (this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                  super_CVmHashEntry.nxt_) {
      inherit_vocab(this_00);
      add_vocab_to_subclass(this_00,in_RDI);
    }
  }
  return;
}

Assistant:

void CTcSymObjBase::inherit_vocab()
{
    /* 
     *   if I've already inherited my superclass vocabulary, there's
     *   nothing more we need to do 
     */
    if (vocab_inherited_)
        return;

    /* make a note that I've inherited my superclass vocabulary */
    vocab_inherited_ = TRUE;

    /* inherit words from each superclass */
    for (CTcObjScEntry *sc = sc_ ; sc != 0 ; sc = sc->nxt_)
    {
        /* make sure this superclass has built its inherited list */
        sc->sym_->inherit_vocab();
        
        /* add this superclass's words to my list */
        sc->sym_->add_vocab_to_subclass((CTcSymObj *)this);
    }
}